

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe_init(uv_loop_t *loop,uv_pipe_t *handle,int ipc)

{
  uv__stream_init(loop,(uv_stream_t *)handle,UV_NAMED_PIPE);
  handle->pipe_fname = (char *)0x0;
  handle->connect_req = (uv_connect_t *)0x0;
  handle->shutdown_req = (uv_shutdown_t *)0x0;
  handle->ipc = ipc;
  return 0;
}

Assistant:

int uv_pipe_init(uv_loop_t* loop, uv_pipe_t* handle, int ipc) {
  uv__stream_init(loop, (uv_stream_t*)handle, UV_NAMED_PIPE);
  handle->shutdown_req = NULL;
  handle->connect_req = NULL;
  handle->pipe_fname = NULL;
  handle->ipc = ipc;
  return 0;
}